

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# magic_enum_containers.hpp
# Opt level: O3

size_type __thiscall
magic_enum::containers::set<Color,_std::less<Color>_>::erase
          (set<Color,_std::less<Color>_> *this,key_type *key)

{
  key_type kVar1;
  sbyte sVar2;
  byte bVar3;
  
  kVar1 = *key;
  if (kVar1 == RED) {
    sVar2 = 0;
  }
  else if (kVar1 == BLUE) {
    sVar2 = 2;
  }
  else {
    if (kVar1 != GREEN) {
      __assert_fail("(i)",
                    "/workspace/llm4binary/github/license_c_cmakelists/Neargye[P]magic_enum/include/magic_enum/magic_enum_containers.hpp"
                    ,0x289,
                    "reference magic_enum::containers::bitset<Color>::operator[](E) [E = Color, Index = magic_enum::containers::detail::indexing<Color>]"
                   );
    }
    sVar2 = 1;
  }
  if ((*(uint *)this >> sVar2 & 1) != 0) {
    this->s = this->s - 1;
  }
  bVar3 = (byte)*(uint *)this;
  (this->a).a._M_elems[0] = ~('\x01' << sVar2) & bVar3;
  return (ulong)(('\x01' << sVar2 & bVar3) != 0);
}

Assistant:

constexpr size_type erase(const key_type& key) noexcept {
    typename container_type::reference ref = a[key];
    bool res = ref;
    if (res) {
      --s;
    }
    ref = false;
    return res;
  }